

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_draw.cpp
# Opt level: O0

Am_Style compute_text_style(bool active,bool depressed,Computed_Colors_Record *color_rec,
                           Am_Widget_Look look,Am_Button_Type type)

{
  bool bVar1;
  bool bVar2;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000039;
  Am_Style_Data *this;
  int in_R9D;
  bool black;
  Am_Button_Type type_local;
  Computed_Colors_Record *color_rec_local;
  bool depressed_local;
  bool active_local;
  Am_Style_Data *pAStack_10;
  Am_Widget_Look look_local;
  
  this = (Am_Style_Data *)CONCAT71(in_register_00000039,active);
  color_rec_local._2_1_ = (byte)color_rec & 1;
  bVar1 = true;
  color_rec_local._3_1_ = depressed;
  color_rec_local._4_4_ = type;
  pAStack_10 = this;
  if (((in_R9D == 0) || (in_R9D == 3)) &&
     ((((bVar2 = Am_Widget_Look::operator==
                           ((Am_Widget_Look *)((long)&color_rec_local + 4),&Am_MACINTOSH_LOOK),
        bVar2 && ((color_rec_local._2_1_ & 1) != 0)) ||
       ((bVar2 = Am_Widget_Look::operator==
                           ((Am_Widget_Look *)((long)&color_rec_local + 4),&Am_MOTIF_LOOK), bVar2 &&
        ((*(byte *)(*(long *)CONCAT44(in_register_0000000c,look.value) + 0x40) & 1) == 0)))) ||
      ((bVar2 = Am_Widget_Look::operator==
                          ((Am_Widget_Look *)((long)&color_rec_local + 4),&Am_WINDOWS_LOOK), bVar2
       && (((*(byte *)(*(long *)CONCAT44(in_register_0000000c,look.value) + 0x40) & 1) == 0 &&
           (((color_rec_local._2_1_ & 1) == 0 || (in_R9D != 3)))))))))) {
    bVar1 = false;
  }
  if ((color_rec_local._3_1_ & 1) == 0) {
    if (bVar1) {
      Am_Style::Am_Style((Am_Style *)this,&Am_Motif_Inactive_Stipple);
    }
    else {
      Am_Style::Am_Style((Am_Style *)this,&Am_Motif_White_Inactive_Stipple);
    }
  }
  else if (bVar1) {
    Am_Style::Am_Style((Am_Style *)this,&Am_Black);
  }
  else {
    Am_Style::Am_Style((Am_Style *)this,&Am_White);
  }
  return (Am_Style)this;
}

Assistant:

Am_Style
compute_text_style(bool active, bool depressed,
                   const Computed_Colors_Record &color_rec, Am_Widget_Look look,
                   Am_Button_Type type)
{
  bool black = true;
  ;
  if ((type == Am_PUSH_BUTTON || type == Am_MENU_BUTTON) &&
      ((look == Am_MACINTOSH_LOOK && depressed) ||
       (look == Am_MOTIF_LOOK && !color_rec.data->light) ||
       (look == Am_WINDOWS_LOOK && !color_rec.data->light &&
        !(depressed && type == Am_MENU_BUTTON))))
    black = false;
  if (active) {
    if (black)
      return Am_Black;
    else
      return Am_White;
  } else {
    if (black)
      return Am_Motif_Inactive_Stipple;
    else
      return Am_Motif_White_Inactive_Stipple;
  }
}